

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_stats.cpp
# Opt level: O0

void duckdb::SetNumericValueInternal
               (Value *input,LogicalType *type,NumericValueUnion *val,bool *has_val)

{
  bool bVar1;
  PhysicalType PVar2;
  PhysicalType PVar3;
  uint8_t uVar4;
  uint16_t uVar5;
  LogicalType *this;
  undefined8 uVar6;
  string *msg;
  undefined1 *in_RCX;
  double *in_RDX;
  LogicalType *in_RSI;
  Value *in_RDI;
  float fVar7;
  double dVar8;
  hugeint_t hVar9;
  uhugeint_t uVar10;
  string *in_stack_ffffffffffffff38;
  InternalException *in_stack_ffffffffffffff40;
  allocator *this_00;
  allocator local_99;
  string local_98 [32];
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  undefined1 local_55;
  allocator local_41;
  string local_40 [32];
  undefined1 *local_20;
  double *local_18;
  LogicalType *local_10;
  Value *local_8;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  bVar1 = Value::IsNull(in_RDI);
  if (bVar1) {
    *local_20 = 0;
  }
  else {
    this = Value::type(local_8);
    PVar2 = LogicalType::InternalType(this);
    PVar3 = LogicalType::InternalType(local_10);
    if (PVar2 != PVar3) {
      local_55 = 1;
      uVar6 = __cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_40,
                 "SetMin or SetMax called with Value that does not match statistics\' column value",
                 &local_41);
      InternalException::InternalException(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      local_55 = 0;
      __cxa_throw(uVar6,&InternalException::typeinfo,InternalException::~InternalException);
    }
    *local_20 = 1;
    PVar2 = LogicalType::InternalType(local_10);
    switch(PVar2) {
    case BOOL:
      bVar1 = BooleanValue::Get((Value *)0xb7a231);
      *(bool *)local_18 = bVar1;
      break;
    case UINT8:
      uVar4 = UTinyIntValue::Get((Value *)0xb7a2ce);
      *(uint8_t *)local_18 = uVar4;
      break;
    case INT8:
      uVar4 = TinyIntValue::Get((Value *)0xb7a252);
      *(uint8_t *)local_18 = uVar4;
      break;
    case UINT16:
      uVar5 = USmallIntValue::Get((Value *)0xb7a2ec);
      *(uint16_t *)local_18 = uVar5;
      break;
    case INT16:
      uVar5 = SmallIntValue::Get((Value *)0xb7a270);
      *(uint16_t *)local_18 = uVar5;
      break;
    case UINT32:
      fVar7 = (float)UIntegerValue::Get((Value *)0xb7a30c);
      *(float *)local_18 = fVar7;
      break;
    case INT32:
      fVar7 = (float)IntegerValue::Get((Value *)0xb7a290);
      *(float *)local_18 = fVar7;
      break;
    case UINT64:
      dVar8 = (double)UBigIntValue::Get((Value *)0xb7a32a);
      *local_18 = dVar8;
      break;
    case INT64:
      dVar8 = (double)BigIntValue::Get((Value *)0xb7a2ae);
      *local_18 = dVar8;
      break;
    case FLOAT:
      fVar7 = FloatValue::Get((Value *)0xb7a3b4);
      *(float *)local_18 = fVar7;
      break;
    case DOUBLE:
      dVar8 = DoubleValue::Get((Value *)0xb7a3d2);
      *local_18 = dVar8;
      break;
    case UINT128:
      uVar10 = UhugeIntValue::Get((Value *)0xb7a37f);
      local_78 = (double)uVar10.lower;
      *local_18 = local_78;
      local_70 = (double)uVar10.upper;
      local_18[1] = local_70;
      break;
    case INT128:
      hVar9 = HugeIntValue::Get((Value *)0xb7a34a);
      local_68 = (double)hVar9.lower;
      *local_18 = local_68;
      local_60 = (double)hVar9.upper;
      local_18[1] = local_60;
      break;
    default:
      msg = (string *)__cxa_allocate_exception(0x10);
      this_00 = &local_99;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_98,"Unsupported type for NumericStatistics::SetValueInternal",this_00);
      InternalException::InternalException((InternalException *)this_00,msg);
      __cxa_throw(msg,&InternalException::typeinfo,InternalException::~InternalException);
    }
  }
  return;
}

Assistant:

void SetNumericValueInternal(const Value &input, const LogicalType &type, NumericValueUnion &val, bool &has_val) {
	if (input.IsNull()) {
		has_val = false;
		return;
	}
	if (input.type().InternalType() != type.InternalType()) {
		throw InternalException("SetMin or SetMax called with Value that does not match statistics' column value");
	}
	has_val = true;
	switch (type.InternalType()) {
	case PhysicalType::BOOL:
		val.value_.boolean = BooleanValue::Get(input);
		break;
	case PhysicalType::INT8:
		val.value_.tinyint = TinyIntValue::Get(input);
		break;
	case PhysicalType::INT16:
		val.value_.smallint = SmallIntValue::Get(input);
		break;
	case PhysicalType::INT32:
		val.value_.integer = IntegerValue::Get(input);
		break;
	case PhysicalType::INT64:
		val.value_.bigint = BigIntValue::Get(input);
		break;
	case PhysicalType::UINT8:
		val.value_.utinyint = UTinyIntValue::Get(input);
		break;
	case PhysicalType::UINT16:
		val.value_.usmallint = USmallIntValue::Get(input);
		break;
	case PhysicalType::UINT32:
		val.value_.uinteger = UIntegerValue::Get(input);
		break;
	case PhysicalType::UINT64:
		val.value_.ubigint = UBigIntValue::Get(input);
		break;
	case PhysicalType::INT128:
		val.value_.hugeint = HugeIntValue::Get(input);
		break;
	case PhysicalType::UINT128:
		val.value_.uhugeint = UhugeIntValue::Get(input);
		break;
	case PhysicalType::FLOAT:
		val.value_.float_ = FloatValue::Get(input);
		break;
	case PhysicalType::DOUBLE:
		val.value_.double_ = DoubleValue::Get(input);
		break;
	default:
		throw InternalException("Unsupported type for NumericStatistics::SetValueInternal");
	}
}